

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O0

void read_debug_pred_weight_table(h264_stream_t *h,bs_t *b)

{
  slice_header_t *psVar1;
  sps_t *psVar2;
  pps_t *ppVar3;
  uint32_t uVar4;
  int32_t iVar5;
  int iVar6;
  FILE *local_118;
  FILE *local_110;
  FILE *local_108;
  FILE *local_100;
  FILE *local_f8;
  FILE *local_f0;
  FILE *local_e8;
  FILE *local_e0;
  FILE *local_d8;
  FILE *local_d0;
  FILE *local_c8;
  FILE *local_c0;
  FILE *local_b8;
  FILE *local_b0;
  FILE *local_a8;
  FILE *local_a0;
  FILE *local_98;
  FILE *local_90;
  FILE *local_88;
  FILE *local_80;
  FILE *local_78;
  FILE *local_70;
  FILE *local_68;
  FILE *local_60;
  FILE *local_58;
  FILE *local_50;
  FILE *local_48;
  FILE *local_40;
  int local_38;
  int local_34;
  int j;
  int i;
  pps_t *pps;
  sps_t *sps;
  slice_header_t *sh;
  bs_t *b_local;
  h264_stream_t *h_local;
  
  psVar1 = h->sh;
  psVar2 = h->sps;
  ppVar3 = h->pps;
  if (h264_dbgfile == (FILE *)0x0) {
    local_40 = _stdout;
  }
  else {
    local_40 = (FILE *)h264_dbgfile;
  }
  fprintf(local_40,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar4 = bs_read_ue(b);
  (psVar1->pwt).luma_log2_weight_denom = uVar4;
  if (h264_dbgfile == (FILE *)0x0) {
    local_48 = _stdout;
  }
  else {
    local_48 = (FILE *)h264_dbgfile;
  }
  fprintf(local_48,"sh->pwt.luma_log2_weight_denom: %d \n",
          (ulong)(uint)(psVar1->pwt).luma_log2_weight_denom);
  if (psVar2->chroma_format_idc != 0) {
    if (h264_dbgfile == (FILE *)0x0) {
      local_50 = _stdout;
    }
    else {
      local_50 = (FILE *)h264_dbgfile;
    }
    fprintf(local_50,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar4 = bs_read_ue(b);
    (psVar1->pwt).chroma_log2_weight_denom = uVar4;
    if (h264_dbgfile == (FILE *)0x0) {
      local_58 = _stdout;
    }
    else {
      local_58 = (FILE *)h264_dbgfile;
    }
    fprintf(local_58,"sh->pwt.chroma_log2_weight_denom: %d \n",
            (ulong)(uint)(psVar1->pwt).chroma_log2_weight_denom);
  }
  for (local_34 = 0; local_34 <= ppVar3->num_ref_idx_l0_active_minus1; local_34 = local_34 + 1) {
    if (h264_dbgfile == (FILE *)0x0) {
      local_60 = _stdout;
    }
    else {
      local_60 = (FILE *)h264_dbgfile;
    }
    fprintf(local_60,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    uVar4 = bs_read_u1(b);
    (psVar1->pwt).luma_weight_l0_flag[local_34] = uVar4;
    if (h264_dbgfile == (FILE *)0x0) {
      local_68 = _stdout;
    }
    else {
      local_68 = (FILE *)h264_dbgfile;
    }
    fprintf(local_68,"sh->pwt.luma_weight_l0_flag[i]: %d \n",
            (ulong)(uint)(psVar1->pwt).luma_weight_l0_flag[local_34]);
    if ((psVar1->pwt).luma_weight_l0_flag[local_34] != 0) {
      if (h264_dbgfile == (FILE *)0x0) {
        local_70 = _stdout;
      }
      else {
        local_70 = (FILE *)h264_dbgfile;
      }
      fprintf(local_70,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      iVar5 = bs_read_se(b);
      (psVar1->pwt).luma_weight_l0[local_34] = iVar5;
      if (h264_dbgfile == (FILE *)0x0) {
        local_78 = _stdout;
      }
      else {
        local_78 = (FILE *)h264_dbgfile;
      }
      fprintf(local_78,"sh->pwt.luma_weight_l0[ i ]: %d \n",
              (ulong)(uint)(psVar1->pwt).luma_weight_l0[local_34]);
      if (h264_dbgfile == (FILE *)0x0) {
        local_80 = _stdout;
      }
      else {
        local_80 = (FILE *)h264_dbgfile;
      }
      fprintf(local_80,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      iVar5 = bs_read_se(b);
      (psVar1->pwt).luma_offset_l0[local_34] = iVar5;
      if (h264_dbgfile == (FILE *)0x0) {
        local_88 = _stdout;
      }
      else {
        local_88 = (FILE *)h264_dbgfile;
      }
      fprintf(local_88,"sh->pwt.luma_offset_l0[ i ]: %d \n",
              (ulong)(uint)(psVar1->pwt).luma_offset_l0[local_34]);
    }
    if (psVar2->chroma_format_idc != 0) {
      if (h264_dbgfile == (FILE *)0x0) {
        local_90 = _stdout;
      }
      else {
        local_90 = (FILE *)h264_dbgfile;
      }
      fprintf(local_90,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar4 = bs_read_u1(b);
      (psVar1->pwt).chroma_weight_l0_flag[local_34] = uVar4;
      if (h264_dbgfile == (FILE *)0x0) {
        local_98 = _stdout;
      }
      else {
        local_98 = (FILE *)h264_dbgfile;
      }
      fprintf(local_98,"sh->pwt.chroma_weight_l0_flag[i]: %d \n",
              (ulong)(uint)(psVar1->pwt).chroma_weight_l0_flag[local_34]);
      if ((psVar1->pwt).chroma_weight_l0_flag[local_34] != 0) {
        for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
          if (h264_dbgfile == (FILE *)0x0) {
            local_a0 = _stdout;
          }
          else {
            local_a0 = (FILE *)h264_dbgfile;
          }
          fprintf(local_a0,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
          iVar5 = bs_read_se(b);
          (psVar1->pwt).chroma_weight_l0[local_34][local_38] = iVar5;
          if (h264_dbgfile == (FILE *)0x0) {
            local_a8 = _stdout;
          }
          else {
            local_a8 = (FILE *)h264_dbgfile;
          }
          fprintf(local_a8,"sh->pwt.chroma_weight_l0[ i ][ j ]: %d \n",
                  (ulong)(uint)(psVar1->pwt).chroma_weight_l0[local_34][local_38]);
          if (h264_dbgfile == (FILE *)0x0) {
            local_b0 = _stdout;
          }
          else {
            local_b0 = (FILE *)h264_dbgfile;
          }
          fprintf(local_b0,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
          iVar5 = bs_read_se(b);
          (psVar1->pwt).chroma_offset_l0[local_34][local_38] = iVar5;
          if (h264_dbgfile == (FILE *)0x0) {
            local_b8 = _stdout;
          }
          else {
            local_b8 = (FILE *)h264_dbgfile;
          }
          fprintf(local_b8,"sh->pwt.chroma_offset_l0[ i ][ j ]: %d \n",
                  (ulong)(uint)(psVar1->pwt).chroma_offset_l0[local_34][local_38]);
        }
      }
    }
  }
  iVar6 = is_slice_type(psVar1->slice_type,1);
  if (iVar6 != 0) {
    for (local_34 = 0; local_34 <= ppVar3->num_ref_idx_l1_active_minus1; local_34 = local_34 + 1) {
      if (h264_dbgfile == (FILE *)0x0) {
        local_c0 = _stdout;
      }
      else {
        local_c0 = (FILE *)h264_dbgfile;
      }
      fprintf(local_c0,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar4 = bs_read_u1(b);
      (psVar1->pwt).luma_weight_l1_flag[local_34] = uVar4;
      if (h264_dbgfile == (FILE *)0x0) {
        local_c8 = _stdout;
      }
      else {
        local_c8 = (FILE *)h264_dbgfile;
      }
      fprintf(local_c8,"sh->pwt.luma_weight_l1_flag[i]: %d \n",
              (ulong)(uint)(psVar1->pwt).luma_weight_l1_flag[local_34]);
      if ((psVar1->pwt).luma_weight_l1_flag[local_34] != 0) {
        if (h264_dbgfile == (FILE *)0x0) {
          local_d0 = _stdout;
        }
        else {
          local_d0 = (FILE *)h264_dbgfile;
        }
        fprintf(local_d0,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        iVar5 = bs_read_se(b);
        (psVar1->pwt).luma_weight_l1[local_34] = iVar5;
        if (h264_dbgfile == (FILE *)0x0) {
          local_d8 = _stdout;
        }
        else {
          local_d8 = (FILE *)h264_dbgfile;
        }
        fprintf(local_d8,"sh->pwt.luma_weight_l1[ i ]: %d \n",
                (ulong)(uint)(psVar1->pwt).luma_weight_l1[local_34]);
        if (h264_dbgfile == (FILE *)0x0) {
          local_e0 = _stdout;
        }
        else {
          local_e0 = (FILE *)h264_dbgfile;
        }
        fprintf(local_e0,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        iVar5 = bs_read_se(b);
        (psVar1->pwt).luma_offset_l1[local_34] = iVar5;
        if (h264_dbgfile == (FILE *)0x0) {
          local_e8 = _stdout;
        }
        else {
          local_e8 = (FILE *)h264_dbgfile;
        }
        fprintf(local_e8,"sh->pwt.luma_offset_l1[ i ]: %d \n",
                (ulong)(uint)(psVar1->pwt).luma_offset_l1[local_34]);
      }
      if (psVar2->chroma_format_idc != 0) {
        if (h264_dbgfile == (FILE *)0x0) {
          local_f0 = _stdout;
        }
        else {
          local_f0 = (FILE *)h264_dbgfile;
        }
        fprintf(local_f0,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        uVar4 = bs_read_u1(b);
        (psVar1->pwt).chroma_weight_l1_flag[local_34] = uVar4;
        if (h264_dbgfile == (FILE *)0x0) {
          local_f8 = _stdout;
        }
        else {
          local_f8 = (FILE *)h264_dbgfile;
        }
        fprintf(local_f8,"sh->pwt.chroma_weight_l1_flag[i]: %d \n",
                (ulong)(uint)(psVar1->pwt).chroma_weight_l1_flag[local_34]);
        if ((psVar1->pwt).chroma_weight_l1_flag[local_34] != 0) {
          for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
            if (h264_dbgfile == (FILE *)0x0) {
              local_100 = _stdout;
            }
            else {
              local_100 = (FILE *)h264_dbgfile;
            }
            fprintf(local_100,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
            iVar5 = bs_read_se(b);
            (psVar1->pwt).chroma_weight_l1[local_34][local_38] = iVar5;
            if (h264_dbgfile == (FILE *)0x0) {
              local_108 = _stdout;
            }
            else {
              local_108 = (FILE *)h264_dbgfile;
            }
            fprintf(local_108,"sh->pwt.chroma_weight_l1[ i ][ j ]: %d \n",
                    (ulong)(uint)(psVar1->pwt).chroma_weight_l1[local_34][local_38]);
            if (h264_dbgfile == (FILE *)0x0) {
              local_110 = _stdout;
            }
            else {
              local_110 = (FILE *)h264_dbgfile;
            }
            fprintf(local_110,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
            iVar5 = bs_read_se(b);
            (psVar1->pwt).chroma_offset_l1[local_34][local_38] = iVar5;
            if (h264_dbgfile == (FILE *)0x0) {
              local_118 = _stdout;
            }
            else {
              local_118 = (FILE *)h264_dbgfile;
            }
            fprintf(local_118,"sh->pwt.chroma_offset_l1[ i ][ j ]: %d \n",
                    (ulong)(uint)(psVar1->pwt).chroma_offset_l1[local_34][local_38]);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void read_debug_pred_weight_table(h264_stream_t* h, bs_t* b)
{
    slice_header_t* sh = h->sh;
    sps_t* sps = h->sps;
    pps_t* pps = h->pps;

    int i, j;

    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.luma_log2_weight_denom = bs_read_ue(b); printf("sh->pwt.luma_log2_weight_denom: %d \n", sh->pwt.luma_log2_weight_denom); 
    if( sps->chroma_format_idc != 0 ) //FIXME ChromaArrayType may differ from chroma_format_idc
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.chroma_log2_weight_denom = bs_read_ue(b); printf("sh->pwt.chroma_log2_weight_denom: %d \n", sh->pwt.chroma_log2_weight_denom); 
    }
    for( i = 0; i <= pps->num_ref_idx_l0_active_minus1; i++ )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.luma_weight_l0_flag[i] = bs_read_u1(b); printf("sh->pwt.luma_weight_l0_flag[i]: %d \n", sh->pwt.luma_weight_l0_flag[i]); 
        if( sh->pwt.luma_weight_l0_flag[i] )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.luma_weight_l0[ i ] = bs_read_se(b); printf("sh->pwt.luma_weight_l0[ i ]: %d \n", sh->pwt.luma_weight_l0[ i ]); 
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.luma_offset_l0[ i ] = bs_read_se(b); printf("sh->pwt.luma_offset_l0[ i ]: %d \n", sh->pwt.luma_offset_l0[ i ]); 
        }
        if ( sps->chroma_format_idc != 0 ) //FIXME ChromaArrayType may differ from chroma_format_idc
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.chroma_weight_l0_flag[i] = bs_read_u1(b); printf("sh->pwt.chroma_weight_l0_flag[i]: %d \n", sh->pwt.chroma_weight_l0_flag[i]); 
            if( sh->pwt.chroma_weight_l0_flag[i] )
            {
                for( j =0; j < 2; j++ )
                {
                    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.chroma_weight_l0[ i ][ j ] = bs_read_se(b); printf("sh->pwt.chroma_weight_l0[ i ][ j ]: %d \n", sh->pwt.chroma_weight_l0[ i ][ j ]); 
                    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.chroma_offset_l0[ i ][ j ] = bs_read_se(b); printf("sh->pwt.chroma_offset_l0[ i ][ j ]: %d \n", sh->pwt.chroma_offset_l0[ i ][ j ]); 
                }
            }
        }
    }
    if( is_slice_type( sh->slice_type, SH_SLICE_TYPE_B ) )
    {
        for( i = 0; i <= pps->num_ref_idx_l1_active_minus1; i++ )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.luma_weight_l1_flag[i] = bs_read_u1(b); printf("sh->pwt.luma_weight_l1_flag[i]: %d \n", sh->pwt.luma_weight_l1_flag[i]); 
            if( sh->pwt.luma_weight_l1_flag[i] )
            {
                printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.luma_weight_l1[ i ] = bs_read_se(b); printf("sh->pwt.luma_weight_l1[ i ]: %d \n", sh->pwt.luma_weight_l1[ i ]); 
                printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.luma_offset_l1[ i ] = bs_read_se(b); printf("sh->pwt.luma_offset_l1[ i ]: %d \n", sh->pwt.luma_offset_l1[ i ]); 
            }
            if( sps->chroma_format_idc != 0 )
            {
                printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.chroma_weight_l1_flag[i] = bs_read_u1(b); printf("sh->pwt.chroma_weight_l1_flag[i]: %d \n", sh->pwt.chroma_weight_l1_flag[i]); 
                if( sh->pwt.chroma_weight_l1_flag[i] )
                {
                    for( j = 0; j < 2; j++ )
                    {
                        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.chroma_weight_l1[ i ][ j ] = bs_read_se(b); printf("sh->pwt.chroma_weight_l1[ i ][ j ]: %d \n", sh->pwt.chroma_weight_l1[ i ][ j ]); 
                        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.chroma_offset_l1[ i ][ j ] = bs_read_se(b); printf("sh->pwt.chroma_offset_l1[ i ][ j ]: %d \n", sh->pwt.chroma_offset_l1[ i ][ j ]); 
                    }
                }
            }
        }
    }
}